

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator * __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
::iterator::operator++(iterator *this)

{
  AssertIsFull(this->ctrl_,'\0',(GenerationType *)0x0,"operator++");
  this->ctrl_ = this->ctrl_ + 1;
  (this->field_1).slot_ = (this->field_1).slot_ + 1;
  skip_empty_or_deleted(this);
  if (*this->ctrl_ == kSentinel) {
    this->ctrl_ = (ctrl_t *)0x0;
  }
  return this;
}

Assistant:

iterator& operator++() {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator++");
      ++ctrl_;
      ++slot_;
      skip_empty_or_deleted();
      if (ABSL_PREDICT_FALSE(*ctrl_ == ctrl_t::kSentinel)) ctrl_ = nullptr;
      return *this;
    }